

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

void __thiscall
cmConditionEvaluator::HandlePredicate
          (cmConditionEvaluator *this,bool value,int *reducible,iterator *arg,
          cmArgumentList *newArgs,iterator *argP1,iterator *argP2)

{
  undefined7 in_register_00000031;
  string *this_00;
  cmConditionEvaluator *this_01;
  allocator<char> local_91;
  string local_90;
  string local_70;
  cmExpandedCommandArgument local_50;
  
  if ((int)CONCAT71(in_register_00000031,value) == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"0",&local_91);
    cmExpandedCommandArgument::cmExpandedCommandArgument(&local_50,&local_90,true);
    cmExpandedCommandArgument::operator=((cmExpandedCommandArgument *)(arg->_M_node + 1),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = &local_90;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"1",&local_91);
    cmExpandedCommandArgument::cmExpandedCommandArgument(&local_50,&local_70,true);
    cmExpandedCommandArgument::operator=((cmExpandedCommandArgument *)(arg->_M_node + 1),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = &local_70;
  }
  std::__cxx11::string::~string((string *)this_00);
  this_01 = (cmConditionEvaluator *)newArgs;
  std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::erase
            (newArgs,argP1->_M_node);
  argP1->_M_node = arg->_M_node;
  IncrementArguments(this_01,newArgs,argP1,argP2);
  *reducible = 1;
  return;
}

Assistant:

void cmConditionEvaluator::HandlePredicate(
  bool value, int& reducible, cmArgumentList::iterator& arg,
  cmArgumentList& newArgs, cmArgumentList::iterator& argP1,
  cmArgumentList::iterator& argP2) const
{
  if (value) {
    *arg = cmExpandedCommandArgument("1", true);
  } else {
    *arg = cmExpandedCommandArgument("0", true);
  }
  newArgs.erase(argP1);
  argP1 = arg;
  this->IncrementArguments(newArgs, argP1, argP2);
  reducible = 1;
}